

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.hpp
# Opt level: O2

void __thiscall
Diligent::TextureBase<Diligent::EngineGLImplTraits>::TextureBase
          (TextureBase<Diligent::EngineGLImplTraits> *this,IReferenceCounters *pRefCounters,
          TexViewObjAllocatorType *TexViewObjAllocator,RenderDeviceImplType *pDevice,
          TextureDesc *Desc,bool bIsDeviceInternal)

{
  Uint64 *Args_1;
  RESOURCE_DIMENSION RVar1;
  BIND_FLAGS BVar2;
  Uint32 UVar3;
  ulong uVar4;
  RenderDeviceGLImpl *pDevice_00;
  char (*in_stack_ffffffffffffffc0) [35];
  string msg;
  char local_18 [8];
  
  DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>::
  DeviceObjectBase(&this->
                    super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                   ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>)
  .super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_003d2340;
  this->m_pDefaultViews = (void *)0x0;
  this->m_dbgTexViewObjAllocator = TexViewObjAllocator;
  this->m_State = RESOURCE_STATE_UNKNOWN;
  (this->m_pSparseProps)._M_t.
  super___uniq_ptr_impl<Diligent::SparseTextureProperties,_std::default_delete<Diligent::SparseTextureProperties>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::SparseTextureProperties_*,_std::default_delete<Diligent::SparseTextureProperties>_>
  .super__Head_base<0UL,_Diligent::SparseTextureProperties_*,_false>._M_head_impl =
       (SparseTextureProperties *)0x0;
  (this->m_ViewIndices)._M_elems[0] = 0xff;
  (this->m_ViewIndices)._M_elems[1] = 0xff;
  (this->m_ViewIndices)._M_elems[2] = 0xff;
  (this->m_ViewIndices)._M_elems[3] = 0xff;
  (this->m_ViewIndices)._M_elems[3] = 0xff;
  (this->m_ViewIndices)._M_elems[4] = 0xff;
  (this->m_ViewIndices)._M_elems[5] = 0xff;
  (this->m_ViewIndices)._M_elems[6] = 0xff;
  if ((this->
      super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
      ).m_Desc.MipLevels != 0) goto LAB_001ac2bf;
  RVar1 = (this->
          super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
          ).m_Desc.Type;
  if ((RVar1 & ~RESOURCE_DIM_BUFFER) == RESOURCE_DIM_TEX_1D) {
    UVar3 = ComputeMipLevelsCount
                      ((this->
                       super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                       ).m_Desc.Width);
  }
  else {
    if (RESOURCE_DIM_TEX_CUBE_ARRAY < RVar1) {
LAB_001ac38b:
      FormatString<char[21]>(&msg,(char (*) [21])"Unknown texture type");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"TextureBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
                 ,0x80);
      std::__cxx11::string::~string((string *)&msg);
      goto LAB_001ac2bf;
    }
    if ((0x1b0U >> (RVar1 & 0x1f) & 1) == 0) {
      if (RVar1 != 6) goto LAB_001ac38b;
      UVar3 = ComputeMipLevelsCount
                        ((this->
                         super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                         ).m_Desc.Width,
                         (this->
                         super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                         ).m_Desc.Height,
                         (this->
                         super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                         ).m_Desc.field_3.ArraySize);
    }
    else {
      UVar3 = ComputeMipLevelsCount
                        ((this->
                         super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                         ).m_Desc.Width,
                         (this->
                         super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                         ).m_Desc.Height);
    }
  }
  (this->
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>)
  .m_Desc.MipLevels = UVar3;
LAB_001ac2bf:
  DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>::
  GetDevice(&this->
             super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
           );
  if (((this->
       super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
       ).m_Desc.ImmediateContextMask & 1) == 0) {
    DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>::
    GetDevice(&this->
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
             );
    Args_1 = &(this->
              super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
              ).m_Desc.ImmediateContextMask;
    local_18[0] = '\x01';
    local_18[1] = '\0';
    local_18[2] = '\0';
    local_18[3] = '\0';
    local_18[4] = '\0';
    local_18[5] = '\0';
    local_18[6] = '\0';
    local_18[7] = '\0';
    FormatString<char[42],std::ios_base&(std::ios_base&),unsigned_long,char[24],unsigned_long,char[35]>
              (&msg,(Diligent *)"No bits in the immediate context mask (0x",(char (*) [42])std::hex,
               (_func_ios_base_ptr_ios_base_ptr *)Args_1,(unsigned_long *)") correspond to one of ",
               (char (*) [24])local_18,(unsigned_long *)" available software command queues",
               in_stack_ffffffffffffffc0);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"TextureBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0x87);
    std::__cxx11::string::~string((string *)&msg);
    uVar4 = (ulong)((uint)*Args_1 & 1);
  }
  else {
    uVar4 = 1;
  }
  (this->
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>)
  .m_Desc.ImmediateContextMask = uVar4;
  pDevice_00 = DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               ::GetDevice(&this->
                            super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                          );
  ValidateTextureDesc(&(this->
                       super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                       ).m_Desc,(IRenderDevice *)pDevice_00);
  BVar2 = (this->
          super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
          ).m_Desc.BindFlags;
  if ((BVar2 >> 9 & 1) != 0) {
    (this->
    super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
    ).m_Desc.BindFlags = BVar2 | BIND_SHADER_RESOURCE;
  }
  return;
}

Assistant:

TextureBase(IReferenceCounters*      pRefCounters,
                TexViewObjAllocatorType& TexViewObjAllocator,
                RenderDeviceImplType*    pDevice,
                const TextureDesc&       Desc,
                bool                     bIsDeviceInternal = false) :
        // clang-format off
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal}
#ifdef DILIGENT_DEBUG
        , m_dbgTexViewObjAllocator{TexViewObjAllocator}
#endif
    // clang-format on
    {
        m_ViewIndices.fill(Uint8{InvalidViewIndex});

        if (this->m_Desc.MipLevels == 0)
        {
            // Compute the number of levels in the full mipmap chain
            if (this->m_Desc.Is1D())
            {
                this->m_Desc.MipLevels = ComputeMipLevelsCount(this->m_Desc.Width);
            }
            else if (this->m_Desc.Is2D())
            {
                this->m_Desc.MipLevels = ComputeMipLevelsCount(this->m_Desc.Width, this->m_Desc.Height);
            }
            else if (this->m_Desc.Is3D())
            {
                this->m_Desc.MipLevels = ComputeMipLevelsCount(this->m_Desc.Width, this->m_Desc.Height, this->m_Desc.Depth);
            }
            else
            {
                UNEXPECTED("Unknown texture type");
            }
        }

        Uint64 DeviceQueuesMask = this->GetDevice()->GetCommandQueueMask();
        DEV_CHECK_ERR((this->m_Desc.ImmediateContextMask & DeviceQueuesMask) != 0,
                      "No bits in the immediate context mask (0x", std::hex, this->m_Desc.ImmediateContextMask,
                      ") correspond to one of ", this->GetDevice()->GetCommandQueueCount(), " available software command queues");
        this->m_Desc.ImmediateContextMask &= DeviceQueuesMask;

        // Validate correctness of texture description
        ValidateTextureDesc(this->m_Desc, this->GetDevice());

        if ((this->m_Desc.BindFlags & BIND_INPUT_ATTACHMENT) != 0)
            this->m_Desc.BindFlags |= BIND_SHADER_RESOURCE;
    }